

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void testing::internal::JsonUnitTestResultPrinter::OutputJsonTestResult
               (ostream *stream,TestResult *result)

{
  bool bVar1;
  int iVar2;
  TestPartResult *pTVar3;
  ostream *poVar4;
  long *plVar5;
  undefined8 *puVar6;
  long *in_RCX;
  int iVar7;
  internal *piVar8;
  int iVar9;
  undefined1 local_d8 [8];
  string message;
  long local_a8;
  long lStack_a0;
  size_type *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string location;
  string kIndent;
  
  location.field_2._8_8_ = &kIndent._M_string_length;
  kIndent.field_2._8_8_ = stream;
  std::__cxx11::string::_M_construct((ulong)((long)&location.field_2 + 8),'\n');
  iVar7 = 0;
  bVar1 = false;
  if (0 < (int)((ulong)((long)(result->test_part_results_).
                              super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(result->test_part_results_).
                             super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x49249249) {
    iVar9 = 0;
    do {
      pTVar3 = TestResult::GetTestPartResult(result,iVar9);
      iVar2 = (int)in_RCX;
      if (pTVar3->type_ - kNonFatalFailure < 2) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)kIndent.field_2._8_8_,",\n",2)
        ;
        if (iVar7 == 0) {
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)kIndent.field_2._8_8_,(char *)location.field_2._8_8_,
                              (long)kIndent._M_dataplus._M_p);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"failures",8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\": [\n",5);
        }
        piVar8 = (internal *)(pTVar3->file_name_)._M_string_length;
        if (piVar8 != (internal *)0x0) {
          piVar8 = (internal *)(pTVar3->file_name_)._M_dataplus._M_p;
        }
        FormatCompilerIndependentFileLocation_abi_cxx11_
                  ((string *)((long)&__str.field_2 + 8),piVar8,
                   (char *)(ulong)(uint)pTVar3->line_number_,iVar2);
        local_98 = &__str._M_string_length;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,__str.field_2._8_8_,
                   location._M_dataplus._M_p + __str.field_2._8_8_);
        std::__cxx11::string::append((char *)&local_98);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_98);
        message.field_2._8_8_ = &stack0xffffffffffffff58;
        in_RCX = plVar5 + 2;
        if ((long *)*plVar5 == in_RCX) {
          local_a8 = *in_RCX;
          lStack_a0 = plVar5[3];
        }
        else {
          local_a8 = *in_RCX;
          message.field_2._8_8_ = (long *)*plVar5;
        }
        *plVar5 = (long)in_RCX;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        EscapeJson((string *)local_d8,(string *)((long)&message.field_2 + 8));
        if ((long *)message.field_2._8_8_ != &stack0xffffffffffffff58) {
          operator_delete((void *)message.field_2._8_8_,local_a8 + 1);
        }
        if (local_98 != &__str._M_string_length) {
          operator_delete(local_98,__str._M_string_length + 1);
        }
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)kIndent.field_2._8_8_,(char *)location.field_2._8_8_,
                            (long)kIndent._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  {\n",4);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(char *)location.field_2._8_8_,(long)kIndent._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"    \"failure\": \"",0x10);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(char *)local_d8,(long)message._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\",\n",3);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(char *)location.field_2._8_8_,(long)kIndent._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"    \"type\": \"\"\n",0xf);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(char *)location.field_2._8_8_,(long)kIndent._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  }",3);
        if (local_d8 != (undefined1  [8])&message._M_string_length) {
          operator_delete((void *)local_d8,message._M_string_length + 1);
        }
        if ((size_type *)__str.field_2._8_8_ != &location._M_string_length) {
          operator_delete((void *)__str.field_2._8_8_,location._M_string_length + 1);
        }
        iVar7 = iVar7 + 1;
      }
      iVar9 = iVar9 + 1;
      iVar2 = (int)((ulong)((long)(result->test_part_results_).
                                  super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(result->test_part_results_).
                                 super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4);
    } while (SBORROW4(iVar9,iVar2 * -0x49249249) != iVar9 + iVar2 * 0x49249249 < 0);
    bVar1 = 0 < iVar7;
  }
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)kIndent.field_2._8_8_,"\n",1);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)kIndent.field_2._8_8_,(char *)location.field_2._8_8_,
                        (long)kIndent._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]",1);
  }
  if (0 < (int)((ulong)((long)(result->test_part_results_).
                              super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(result->test_part_results_).
                             super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x49249249) {
    iVar9 = 0;
    iVar7 = 0;
    do {
      pTVar3 = TestResult::GetTestPartResult(result,iVar9);
      iVar2 = (int)in_RCX;
      if (pTVar3->type_ == kSkip) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)kIndent.field_2._8_8_,",\n",2)
        ;
        if (iVar7 == 0) {
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)kIndent.field_2._8_8_,(char *)location.field_2._8_8_,
                              (long)kIndent._M_dataplus._M_p);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"skipped",7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\": [\n",5);
        }
        piVar8 = (internal *)(pTVar3->file_name_)._M_string_length;
        if (piVar8 != (internal *)0x0) {
          piVar8 = (internal *)(pTVar3->file_name_)._M_dataplus._M_p;
        }
        FormatCompilerIndependentFileLocation_abi_cxx11_
                  ((string *)((long)&__str.field_2 + 8),piVar8,
                   (char *)(ulong)(uint)pTVar3->line_number_,iVar2);
        local_98 = &__str._M_string_length;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,__str.field_2._8_8_,
                   location._M_dataplus._M_p + __str.field_2._8_8_);
        std::__cxx11::string::append((char *)&local_98);
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_98);
        message.field_2._8_8_ = &stack0xffffffffffffff58;
        in_RCX = puVar6 + 2;
        if ((long *)*puVar6 == in_RCX) {
          local_a8 = *in_RCX;
          lStack_a0 = puVar6[3];
        }
        else {
          local_a8 = *in_RCX;
          message.field_2._8_8_ = (long *)*puVar6;
        }
        *puVar6 = in_RCX;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        EscapeJson((string *)local_d8,(string *)((long)&message.field_2 + 8));
        if ((long *)message.field_2._8_8_ != &stack0xffffffffffffff58) {
          operator_delete((void *)message.field_2._8_8_,local_a8 + 1);
        }
        if (local_98 != &__str._M_string_length) {
          operator_delete(local_98,__str._M_string_length + 1);
        }
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)kIndent.field_2._8_8_,(char *)location.field_2._8_8_,
                            (long)kIndent._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  {\n",4);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(char *)location.field_2._8_8_,(long)kIndent._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"    \"message\": \"",0x10);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(char *)local_d8,(long)message._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"\n",2);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(char *)location.field_2._8_8_,(long)kIndent._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  }",3);
        if (local_d8 != (undefined1  [8])&message._M_string_length) {
          operator_delete((void *)local_d8,message._M_string_length + 1);
        }
        if ((size_type *)__str.field_2._8_8_ != &location._M_string_length) {
          operator_delete((void *)__str.field_2._8_8_,location._M_string_length + 1);
        }
        iVar7 = iVar7 + 1;
      }
      iVar9 = iVar9 + 1;
      iVar2 = (int)((ulong)((long)(result->test_part_results_).
                                  super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(result->test_part_results_).
                                 super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4);
    } while (SBORROW4(iVar9,iVar2 * -0x49249249) != iVar9 + iVar2 * 0x49249249 < 0);
    if (0 < iVar7) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)kIndent.field_2._8_8_,"\n",1);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)kIndent.field_2._8_8_,(char *)location.field_2._8_8_,
                          (long)kIndent._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]",1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)kIndent.field_2._8_8_,"\n",1);
  __str.field_2._8_8_ = &location._M_string_length;
  std::__cxx11::string::_M_construct((ulong)((long)&__str.field_2 + 8),'\b');
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)kIndent.field_2._8_8_,(char *)__str.field_2._8_8_,
                      (long)location._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}",1);
  if ((size_type *)__str.field_2._8_8_ != &location._M_string_length) {
    operator_delete((void *)__str.field_2._8_8_,location._M_string_length + 1);
  }
  if ((size_type *)location.field_2._8_8_ != &kIndent._M_string_length) {
    operator_delete((void *)location.field_2._8_8_,kIndent._M_string_length + 1);
  }
  return;
}

Assistant:

void JsonUnitTestResultPrinter::OutputJsonTestResult(::std::ostream* stream,
                                                     const TestResult& result) {
  const std::string kIndent = Indent(10);

  {
    int failures = 0;
    for (int i = 0; i < result.total_part_count(); ++i) {
      const TestPartResult& part = result.GetTestPartResult(i);
      if (part.failed()) {
        *stream << ",\n";
        if (++failures == 1) {
          *stream << kIndent << "\"" << "failures" << "\": [\n";
        }
        const std::string location =
            internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                            part.line_number());
        const std::string message =
            EscapeJson(location + "\n" + part.message());
        *stream << kIndent << "  {\n"
                << kIndent << "    \"failure\": \"" << message << "\",\n"
                << kIndent << "    \"type\": \"\"\n"
                << kIndent << "  }";
      }
    }

    if (failures > 0) *stream << "\n" << kIndent << "]";
  }

  {
    int skipped = 0;
    for (int i = 0; i < result.total_part_count(); ++i) {
      const TestPartResult& part = result.GetTestPartResult(i);
      if (part.skipped()) {
        *stream << ",\n";
        if (++skipped == 1) {
          *stream << kIndent << "\"" << "skipped" << "\": [\n";
        }
        const std::string location =
            internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                            part.line_number());
        const std::string message =
            EscapeJson(location + "\n" + part.message());
        *stream << kIndent << "  {\n"
                << kIndent << "    \"message\": \"" << message << "\"\n"
                << kIndent << "  }";
      }
    }

    if (skipped > 0) *stream << "\n" << kIndent << "]";
  }

  *stream << "\n" << Indent(8) << "}";
}